

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

void RemoveFromLink<stCoCondItem_t,stCoCond_t>(stCoCondItem_t *ap)

{
  stCoCond_t *psVar1;
  stCoCondItem_t *psVar2;
  stCoCondItem_t *psVar3;
  
  psVar1 = ap->pLink;
  if (psVar1 != (stCoCond_t *)0x0) {
    if ((psVar1->head == (stCoCondItem_t *)0x0) ||
       (psVar2 = psVar1->tail, psVar2 == (stCoCondItem_t *)0x0)) {
      __assert_fail("lst->head && lst->tail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abhinavabcd[P]libco/co_routine.cpp"
                    ,0x9c,"void RemoveFromLink(T *) [T = stCoCondItem_t, TLink = stCoCond_t]");
    }
    if (psVar1->head == ap) {
      psVar3 = ap->pNext;
      psVar1->head = psVar3;
      if (psVar3 != (stCoCondItem_t *)0x0) {
        psVar3->pPrev = (stCoCondItem_t *)0x0;
      }
    }
    else if (ap->pPrev != (stCoCondItem_t *)0x0) {
      ap->pPrev->pNext = ap->pNext;
    }
    psVar3 = ap->pPrev;
    if (psVar2 == ap) {
      psVar1->tail = psVar3;
      if (psVar3 != (stCoCondItem_t *)0x0) {
        psVar3->pNext = (stCoCondItem_t *)0x0;
      }
    }
    else {
      ap->pNext->pPrev = psVar3;
    }
    ap->pPrev = (stCoCondItem_t *)0x0;
    ap->pNext = (stCoCondItem_t *)0x0;
    ap->pLink = (stCoCond_t *)0x0;
  }
  return;
}

Assistant:

void RemoveFromLink(T *ap)
{
	TLink *lst = ap->pLink;
	if(!lst) return ;
	assert( lst->head && lst->tail );

	if( ap == lst->head )
	{
		lst->head = ap->pNext;
		if(lst->head)
		{
			lst->head->pPrev = NULL;
		}
	}
	else
	{
		if(ap->pPrev)
		{
			ap->pPrev->pNext = ap->pNext;
		}
	}

	if( ap == lst->tail )
	{
		lst->tail = ap->pPrev;
		if(lst->tail)
		{
			lst->tail->pNext = NULL;
		}
	}
	else
	{
		ap->pNext->pPrev = ap->pPrev;
	}

	ap->pPrev = ap->pNext = NULL;
	ap->pLink = NULL;
}